

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O2

int mbedtls_ecdh_compute_shared
              (mbedtls_ecp_group *grp,mbedtls_mpi *z,mbedtls_ecp_point *Q,mbedtls_mpi *d,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  undefined1 local_68 [8];
  mbedtls_ecp_point P;
  
  P.Z._8_8_ = z;
  mbedtls_ecp_point_init((mbedtls_ecp_point *)local_68);
  iVar1 = mbedtls_ecp_mul_restartable
                    (grp,(mbedtls_ecp_point *)local_68,d,Q,f_rng,p_rng,
                     (mbedtls_ecp_restart_ctx *)0x0);
  if (iVar1 == 0) {
    iVar2 = mbedtls_ecp_is_zero((mbedtls_ecp_point *)local_68);
    iVar1 = -0x4f80;
    if (iVar2 == 0) {
      iVar1 = mbedtls_mpi_copy((mbedtls_mpi *)P.Z._8_8_,(mbedtls_mpi *)local_68);
    }
  }
  mbedtls_ecp_point_free((mbedtls_ecp_point *)local_68);
  return iVar1;
}

Assistant:

int mbedtls_ecdh_compute_shared(mbedtls_ecp_group *grp, mbedtls_mpi *z,
                                const mbedtls_ecp_point *Q, const mbedtls_mpi *d,
                                int (*f_rng)(void *, unsigned char *, size_t),
                                void *p_rng)
{
    return ecdh_compute_shared_restartable(grp, z, Q, d,
                                           f_rng, p_rng, NULL);
}